

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_option.hpp
# Opt level: O2

string * __thiscall
duckdb::CSVOption<duckdb::NewLineIdentifier>::FormatValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,CSVOption<duckdb::NewLineIdentifier> *this,
          NewLineIdentifier *val)

{
  InternalException *this_00;
  char *pcVar1;
  allocator local_39;
  string local_38;
  
  switch(*val) {
  case SINGLE_N:
    pcVar1 = "\\n";
    break;
  case CARRY_ON:
    pcVar1 = "\\r\\n";
    break;
  case NOT_SET:
    pcVar1 = "Single-Line File";
    break;
  case SINGLE_R:
    pcVar1 = "\\r";
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"Invalid Newline Detected.",&local_39);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatValueInternal(const NewLineIdentifier &val) const {
		switch (val) {
		case NewLineIdentifier::SINGLE_N:
			return "\\n";
		case NewLineIdentifier::SINGLE_R:
			return "\\r";
		case NewLineIdentifier::CARRY_ON:
			return "\\r\\n";
		case NewLineIdentifier::NOT_SET:
			return "Single-Line File";
		default:
			throw InternalException("Invalid Newline Detected.");
		}
	}